

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * soul::Value::createFloatVectorArray(ChannelArrayView<float> data)

{
  long lVar1;
  Value *in_RDI;
  ulong uVar2;
  float *pfVar3;
  long lVar4;
  long in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  PrimitiveType local_5c;
  Type local_58;
  InterleavedView<float> local_40;
  Type local_28;
  
  local_5c.type = float32;
  Type::createVector(&local_58,&local_5c,(ulong)in_stack_00000018);
  Type::createArray(&local_28,&local_58,(ulong)in_stack_0000001c);
  Value(in_RDI,&local_28);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
  getData((PackedData *)&local_58,in_RDI);
  PackedData::getAsChannelSet32(&local_40,(PackedData *)&local_58);
  if (in_stack_00000018 == local_40.size.numChannels) {
    if (in_stack_0000001c == local_40.size.numFrames) {
      if (in_stack_00000018 != 0) {
        uVar2 = 0;
        do {
          if (in_stack_0000001c != 0) {
            lVar1 = *(long *)(in_stack_00000008 + uVar2 * 8);
            lVar4 = 0;
            pfVar3 = local_40.data.data;
            do {
              *pfVar3 = *(float *)(lVar1 + (ulong)in_stack_00000010 * 4 + lVar4 * 4);
              lVar4 = lVar4 + 1;
              pfVar3 = pfVar3 + local_40.data.stride;
            } while (in_stack_0000001c != (uint)lVar4);
          }
          uVar2 = uVar2 + 1;
          local_40.data.data = local_40.data.data + 1;
        } while (uVar2 != in_stack_00000018);
      }
      return in_RDI;
    }
  }
  throwInternalCompilerError("size == dest.getSize()","copy",0x2e1);
}

Assistant:

Value Value::createFloatVectorArray (choc::buffer::ChannelArrayView<float> data)
{
    Value v (Type::createVector (PrimitiveType::float32, data.getNumChannels()).createArray (data.getNumFrames()));
    copy (v.getAsChannelSet32(), data);
    return v;
}